

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-equalities-101.cpp
# Opt level: O0

rc_size __thiscall
baryonyx::itm::
solver_equalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>
::compute_reduced_costs<baryonyx::bit_array>
          (solver_equalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>
           *this,row_iterator begin,row_iterator end,bit_array *x)

{
  tuple<baryonyx::sparse_matrix<int>::col_value_*,_baryonyx::sparse_matrix<int>::col_value_*> *__t;
  int iVar1;
  __tuple_element_t<0UL,_tuple<col_value_*,_col_value_*>_> pcVar2;
  rc_size rVar3;
  bool bVar4;
  __tuple_element_t<0UL,_tuple<col_value_*,_col_value_*>_> *ppcVar5;
  __tuple_element_t<1UL,_tuple<col_value_*,_col_value_*>_> *ppcVar6;
  type piVar7;
  type plVar8;
  type prVar9;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble lVar10;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble lVar11;
  longdouble a;
  tuple<baryonyx::sparse_matrix<int>::col_value_*,_baryonyx::sparse_matrix<int>::col_value_*> ht;
  longdouble sum_a_p;
  longdouble sum_a_pi;
  int local_34;
  int c_size;
  int r_size;
  bit_array *x_local;
  row_iterator end_local;
  row_iterator begin_local;
  solver_equalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>
  *this_local;
  
  local_34 = 0;
  stack0xffffffffffffffc8 = 0;
  for (end_local = begin; end_local != end; end_local = end_local + 1) {
    unique0x00076c00 = (longdouble)0;
    lVar11 = in_ST5;
    unique0x100002e0 = unique0x00076c00;
    sparse_matrix<int>::column((sparse_matrix<int> *)((long)&a + 8),(int)this + 0x10);
    lVar10 = in_ST0;
    in_ST0 = in_ST1;
    in_ST1 = in_ST2;
    in_ST2 = in_ST3;
    in_ST3 = in_ST4;
    in_ST4 = in_ST5;
    in_ST5 = lVar11;
    while( true ) {
      ppcVar5 = std::
                get<0ul,baryonyx::sparse_matrix<int>::col_value*,baryonyx::sparse_matrix<int>::col_value*>
                          ((tuple<baryonyx::sparse_matrix<int>::col_value_*,_baryonyx::sparse_matrix<int>::col_value_*>
                            *)((long)&a + 8));
      pcVar2 = *ppcVar5;
      ppcVar6 = std::
                get<1ul,baryonyx::sparse_matrix<int>::col_value*,baryonyx::sparse_matrix<int>::col_value*>
                          ((tuple<baryonyx::sparse_matrix<int>::col_value_*,_baryonyx::sparse_matrix<int>::col_value_*>
                            *)((long)&a + 8));
      if (pcVar2 == *ppcVar6) break;
      __t = (tuple<baryonyx::sparse_matrix<int>::col_value_*,_baryonyx::sparse_matrix<int>::col_value_*>
             *)((long)&a + 8);
      ppcVar5 = std::
                get<0ul,baryonyx::sparse_matrix<int>::col_value*,baryonyx::sparse_matrix<int>::col_value*>
                          (__t);
      piVar7 = std::unique_ptr<int[],_std::default_delete<int[]>_>::operator[]
                         (&this->A,(long)(*ppcVar5)->value);
      iVar1 = *piVar7;
      ppcVar5 = std::
                get<0ul,baryonyx::sparse_matrix<int>::col_value*,baryonyx::sparse_matrix<int>::col_value*>
                          (__t);
      plVar8 = std::unique_ptr<long_double[],_std::default_delete<long_double[]>_>::operator[]
                         (&this->pi,(long)(*ppcVar5)->row);
      register0x00001110 = (longdouble)iVar1 * *plVar8 + stack0xffffffffffffffb8;
      ppcVar5 = std::
                get<0ul,baryonyx::sparse_matrix<int>::col_value*,baryonyx::sparse_matrix<int>::col_value*>
                          (__t);
      plVar8 = std::unique_ptr<long_double[],_std::default_delete<long_double[]>_>::operator[]
                         (&this->P,(long)(*ppcVar5)->value);
      register0x00001110 = (longdouble)iVar1 * *plVar8 + stack0xffffffffffffffa8;
      in_ST4 = in_ST3;
      in_ST5 = in_ST3;
      ppcVar5 = std::
                get<0ul,baryonyx::sparse_matrix<int>::col_value*,baryonyx::sparse_matrix<int>::col_value*>
                          ((tuple<baryonyx::sparse_matrix<int>::col_value_*,_baryonyx::sparse_matrix<int>::col_value_*>
                            *)((long)&a + 8));
      *ppcVar5 = *ppcVar5 + 1;
    }
    prVar9 = std::
             unique_ptr<baryonyx::itm::solver_equalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_equalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::rc_data[]>_>
             ::operator[](&this->R,(long)local_34);
    prVar9->id = local_34;
    quadratic_cost_type<long_double>::operator()
              ((longdouble *)this->c,
               (quadratic_cost_type<long_double> *)(ulong)(uint)end_local->column,(int)x,
               (bit_array *)prVar9);
    lVar10 = (lVar10 - stack0xffffffffffffffb8) - stack0xffffffffffffffa8;
    prVar9 = std::
             unique_ptr<baryonyx::itm::solver_equalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_equalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::rc_data[]>_>
             ::operator[](&this->R,(long)local_34);
    prVar9->value = lVar10;
    piVar7 = std::unique_ptr<int[],_std::default_delete<int[]>_>::operator[]
                       (&this->A,(long)end_local->value);
    iVar1 = *piVar7;
    prVar9 = std::
             unique_ptr<baryonyx::itm::solver_equalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_equalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::rc_data[]>_>
             ::operator[](&this->R,(long)local_34);
    prVar9->f = iVar1;
    prVar9 = std::
             unique_ptr<baryonyx::itm::solver_equalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_equalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::rc_data[]>_>
             ::operator[](&this->R,(long)local_34);
    bVar4 = rc_data::is_negative_factor(prVar9);
    if (bVar4) {
      prVar9 = std::
               unique_ptr<baryonyx::itm::solver_equalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_equalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::rc_data[]>_>
               ::operator[](&this->R,(long)local_34);
      lVar10 = prVar9->value;
      prVar9 = std::
               unique_ptr<baryonyx::itm::solver_equalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_equalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::rc_data[]>_>
               ::operator[](&this->R,(long)local_34);
      prVar9->value = -lVar10;
      register0x00000000 = stack0xffffffffffffffc8 + 1;
    }
    local_34 = local_34 + 1;
  }
  rVar3.c_size = stack0xffffffffffffffc8;
  rVar3.r_size = local_34;
  return rVar3;
}

Assistant:

rc_size compute_reduced_costs(sparse_matrix<int>::row_iterator begin,
                                  sparse_matrix<int>::row_iterator end,
                                  const Xtype& x) noexcept
    {
        int r_size = 0;
        int c_size = 0;

        for (; begin != end; ++begin) {
            Float sum_a_pi = 0;
            Float sum_a_p = 0;

            auto ht = ap.column(begin->column);

            for (; std::get<0>(ht) != std::get<1>(ht); ++std::get<0>(ht)) {
                auto a = static_cast<Float>(A[std::get<0>(ht)->value]);

                sum_a_pi += a * pi[std::get<0>(ht)->row];
                sum_a_p += a * P[std::get<0>(ht)->value];
            }

            R[r_size].id = r_size;
            R[r_size].value = c(begin->column, x) - sum_a_pi - sum_a_p;
            R[r_size].f = A[begin->value];

            if (R[r_size].is_negative_factor()) {
                R[r_size].value = -R[r_size].value;
                ++c_size;
            }

            ++r_size;
        }

        return { r_size, c_size };
    }